

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O0

void ssh1_bpp_format_packet(ssh1_bpp_state *s,PktOut *pkt)

{
  LogContext *ctx;
  uint32_t value;
  int iVar1;
  int iVar2;
  uint32_t value_00;
  char *texttype;
  ptrlen pVar3;
  int local_8c;
  uchar *puStack_88;
  int complen;
  uchar *compblk;
  undefined1 local_78 [4];
  int nblanks;
  logblank_t blanks [4];
  void *local_40;
  ptrlen pktdata;
  int len;
  uint32_t crc;
  int pktoffs;
  int biglen;
  int pad;
  PktOut *pkt_local;
  ssh1_bpp_state *s_local;
  
  if ((s->bpp).logctx != (LogContext *)0x0) {
    pVar3 = make_ptrlen(pkt->data + pkt->prefix,pkt->length - pkt->prefix);
    compblk._4_4_ = ssh1_censor_packet((s->bpp).pls,pkt->type,true,pVar3,(logblank_t *)local_78);
    ctx = (s->bpp).logctx;
    iVar2 = pkt->type;
    texttype = ssh1_pkt_type(pkt->type);
    local_40 = pVar3.ptr;
    pktdata.ptr = (void *)pVar3.len;
    log_packet(ctx,1,iVar2,texttype,local_40,(size_t)pktdata.ptr,compblk._4_4_,
               (logblank_t *)local_78,(unsigned_long *)0x0,0,(char *)0x0);
  }
  if (s->compctx != (ssh_compressor *)0x0) {
    ssh_compressor_compress
              (s->compctx,pkt->data + 0xc,(int)pkt->length + -0xc,&stack0xffffffffffffff78,&local_8c
               ,0);
    pkt->length = 0xc;
    BinarySink_put_data(pkt->binarysink_,puStack_88,(long)local_8c);
    safefree(puStack_88);
  }
  BinarySink_put_uint32(pkt->binarysink_,0);
  value = (int)pkt->length - 0xc;
  iVar1 = 8 - (int)value % 8;
  iVar2 = 8 - iVar1;
  iVar1 = value + iVar1;
  random_read(pkt->data + iVar2,(long)(0xc - iVar2));
  pVar3 = make_ptrlen(pkt->data + (long)iVar2 + 4,(long)(iVar1 + -4));
  value_00 = crc32_ssh1(pVar3);
  PUT_32BIT_MSB_FIRST(pkt->data + (long)iVar1 + (long)iVar2,value_00);
  PUT_32BIT_MSB_FIRST(pkt->data + iVar2,value);
  if (s->cipher_out != (ssh_cipher *)0x0) {
    ssh_cipher_encrypt(s->cipher_out,pkt->data + (long)iVar2 + 4,iVar1);
  }
  bufchain_add((s->bpp).out_raw,pkt->data + iVar2,(long)(iVar1 + 4));
  return;
}

Assistant:

static void ssh1_bpp_format_packet(struct ssh1_bpp_state *s, PktOut *pkt)
{
    int pad, biglen, pktoffs;
    uint32_t crc;
    int len;

    if (s->bpp.logctx) {
        ptrlen pktdata = make_ptrlen(pkt->data + pkt->prefix,
                                     pkt->length - pkt->prefix);
        logblank_t blanks[MAX_BLANKS];
        int nblanks = ssh1_censor_packet(
            s->bpp.pls, pkt->type, true, pktdata, blanks);
        log_packet(s->bpp.logctx, PKT_OUTGOING, pkt->type,
                   ssh1_pkt_type(pkt->type),
                   pktdata.ptr, pktdata.len, nblanks, blanks,
                   NULL, 0, NULL);
    }

    if (s->compctx) {
        unsigned char *compblk;
        int complen;
        ssh_compressor_compress(s->compctx, pkt->data + 12, pkt->length - 12,
                                &compblk, &complen, 0);
        /* Replace the uncompressed packet data with the compressed
         * version. */
        pkt->length = 12;
        put_data(pkt, compblk, complen);
        sfree(compblk);
    }

    put_uint32(pkt, 0); /* space for CRC */
    len = pkt->length - 4 - 8;  /* len(type+data+CRC) */
    pad = 8 - (len % 8);
    pktoffs = 8 - pad;
    biglen = len + pad;         /* len(padding+type+data+CRC) */

    random_read(pkt->data + pktoffs, 4+8 - pktoffs);
    crc = crc32_ssh1(
        make_ptrlen(pkt->data + pktoffs + 4, biglen - 4)); /* all ex len */
    PUT_32BIT_MSB_FIRST(pkt->data + pktoffs + 4 + biglen - 4, crc);
    PUT_32BIT_MSB_FIRST(pkt->data + pktoffs, len);

    if (s->cipher_out)
        ssh_cipher_encrypt(s->cipher_out, pkt->data + pktoffs + 4, biglen);

    bufchain_add(s->bpp.out_raw, pkt->data + pktoffs,
                 biglen + 4); /* len(length+padding+type+data+CRC) */
}